

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

void __thiscall QDateTimeEdit::setSelectedSection(QDateTimeEdit *this,Section section)

{
  QDateTimeEditPrivate *this_00;
  QLineEdit *this_01;
  Section s;
  Section SVar1;
  int start;
  QDateTimeEditPrivate *d;
  
  this_00 = *(QDateTimeEditPrivate **)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  if (section == NoSection) {
    this_01 = (this_00->super_QAbstractSpinBoxPrivate).edit;
    start = QLineEdit::cursorPosition(this_01);
    QLineEdit::setSelection(this_01,start,0);
    return;
  }
  if (((this_00->sections).super_QFlagsStorageHelper<QDateTimeEdit::Section,_4>.
       super_QFlagsStorage<QDateTimeEdit::Section>.i & section) != NoSection) {
    s = QDateTimeParser::sectionType((int)this_00 + 0x3d8);
    SVar1 = QDateTimeEditPrivate::convertToPublic(s);
    if (SVar1 != section) {
      setCurrentSection(this,section);
    }
    QDateTimeEditPrivate::setSelected(this_00,*(int *)&this_00->field_0x3e0,false);
    return;
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }